

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clReleaseSemaphoreKHR(cl_semaphore_khr semaphore)

{
  time_point start;
  bool bVar1;
  CLIntercept *this;
  CLdispatchX *pCVar2;
  uint64_t enqueueCounter_00;
  SConfig *pSVar3;
  cl_semaphore_khr in_RDI;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_uint ref_count;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  cl_int in_stack_00000114;
  char *in_stack_00000118;
  CLIntercept *in_stack_00000120;
  undefined8 in_stack_fffffffffffffef8;
  cl_semaphore_khr p_Var4;
  undefined4 uVar5;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  allocator *paVar6;
  CLIntercept *in_stack_ffffffffffffff10;
  CObjectTracker *in_stack_ffffffffffffff18;
  cl_uint local_e0;
  int local_dc;
  duration local_d8;
  char *local_d0;
  allocator local_c1;
  string local_c0 [24];
  cl_semaphore_khr in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  undefined1 local_79 [9];
  uint64_t in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  CLIntercept *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  time_point in_stack_ffffffffffffffb8;
  duration in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_4;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pCVar2 = CLIntercept::dispatchX
                         (in_stack_ffffffffffffff10,(cl_semaphore_khr)in_stack_ffffffffffffff08),
     pCVar2->clReleaseSemaphoreKHR == (_func_cl_int_cl_semaphore_khr *)0x0)) {
    local_dc = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_dc);
    local_4 = 0xfffffb8a;
  }
  else {
    enqueueCounter_00 = CLIntercept::getEnqueueCounter(in_stack_ffffffffffffff08);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) == 0) {
      local_e0 = 0;
    }
    else {
      local_e0 = CLIntercept::getRefCount(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      p_Var4 = in_RDI;
      CLIntercept::callLoggingEnter
                (this,"clReleaseSemaphoreKHR",enqueueCounter_00,(cl_kernel)0x0,
                 "[ ref count = %d ] semaphore = %p",(ulong)local_e0,in_RDI);
      uVar5 = (undefined4)((ulong)p_Var4 >> 0x20);
    }
    CLIntercept::checkRemoveSemaphoreInfo
              ((CLIntercept *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (cl_semaphore_khr)in_stack_ffffffffffffffa8);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc8.__d.__r = in_stack_ffffffffffffffb8.__d.__r;
    }
    local_4 = (*pCVar2->clReleaseSemaphoreKHR)(in_RDI);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa8 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__r = (rep)in_stack_ffffffffffffffa8;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
         bVar1)) {
        in_stack_ffffffffffffff18 = (CObjectTracker *)local_79;
        in_stack_ffffffffffffff10 = this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_79 + 1),"",(allocator *)in_stack_ffffffffffffff18);
        start.__d.__r._4_4_ = local_e0;
        start.__d.__r._0_4_ = in_stack_ffffffffffffffd0;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffffc0.__r,
                   (char *)in_stack_ffffffffffffffb8.__d.__r,
                   (string *)CONCAT44(local_4,in_stack_ffffffffffffffb0),start,
                   in_stack_ffffffffffffffc8);
        std::__cxx11::string::~string((string *)(local_79 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_79);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000120,in_stack_00000118,in_stack_00000114);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(this);
      CObjectTracker::AddRelease<_cl_semaphore_khr*>
                (in_stack_ffffffffffffff18,(_cl_semaphore_khr *)in_stack_ffffffffffffff10);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this,"clReleaseSemaphoreKHR",(cl_int)(ulong)local_4,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"[ ref count = %d ]",CONCAT44(uVar5,local_e0 - 1));
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar6 = &local_c1;
      std::allocator<char>::allocator();
      local_d8.__r = in_stack_ffffffffffffffc0.__r;
      local_d0 = (char *)in_stack_ffffffffffffffc8.__d.__r;
      std::__cxx11::string::string(local_c0,"",paVar6);
      CLIntercept::chromeCallLoggingExit
                ((CLIntercept *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                 (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,(time_point)local_d8.__r,
                 in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clReleaseSemaphoreKHR(
    cl_semaphore_khr semaphore)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(semaphore);
        if( dispatchX.clReleaseSemaphoreKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_uint ref_count =
                pIntercept->config().CallLogging ?
                pIntercept->getRefCount( semaphore ) : 0;
            CALL_LOGGING_ENTER( "[ ref count = %d ] semaphore = %p",
                ref_count,
                semaphore );
            pIntercept->checkRemoveSemaphoreInfo( semaphore );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clReleaseSemaphoreKHR(
                semaphore );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            ADD_OBJECT_RELEASE( semaphore );
            CALL_LOGGING_EXIT( retVal, "[ ref count = %d ]", --ref_count );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_SEMAPHORE_KHR);
}